

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spgmr_serial.c
# Opt level: O3

int ATimes(void *Data,N_Vector v_vec,N_Vector z_vec)

{
  long lVar1;
  realtype *prVar2;
  realtype *prVar3;
  realtype *prVar4;
  realtype *prVar5;
  long lVar6;
  
  prVar2 = N_VGetArrayPointer(v_vec);
  if (prVar2 == (realtype *)0x0) {
    ATimes_cold_4();
  }
  else {
    prVar3 = N_VGetArrayPointer(z_vec);
    if (prVar3 == (realtype *)0x0) {
      ATimes_cold_3();
    }
    else {
      prVar4 = N_VGetArrayPointer(*(N_Vector *)((long)Data + 0x10));
      if (prVar4 == (realtype *)0x0) {
        ATimes_cold_2();
      }
      else {
        prVar5 = N_VGetArrayPointer(*(N_Vector *)((long)Data + 0x18));
        if (prVar5 != (realtype *)0x0) {
          lVar1 = *Data;
          *prVar3 = (*prVar2 * 5.0 * *prVar5 - prVar5[1] * prVar2[1]) / *prVar4;
          if (2 < lVar1) {
            lVar6 = 0;
            do {
              prVar3[lVar6 + 1] =
                   ((prVar2[lVar6 + 1] * 5.0 * prVar5[lVar6 + 1] - prVar2[lVar6] * prVar5[lVar6]) -
                   prVar2[lVar6 + 2] * prVar5[lVar6 + 2]) / prVar4[lVar6 + 1];
              lVar6 = lVar6 + 1;
            } while (lVar1 + -2 != lVar6);
          }
          prVar3[lVar1 + -1] =
               (prVar2[lVar1 + -1] * 5.0 * prVar5[lVar1 + -1] -
               prVar2[lVar1 + -2] * prVar5[lVar1 + -2]) / prVar4[lVar1 + -1];
          return 0;
        }
        ATimes_cold_1();
      }
    }
  }
  return 1;
}

Assistant:

int ATimes(void* Data, N_Vector v_vec, N_Vector z_vec)
{
  /* local variables */
  realtype *v, *z, *s1, *s2;
  sunindextype i, N;
  UserData *ProbData;
  
  /* access user data structure and vector data */
  ProbData = (UserData *) Data;
  v = N_VGetArrayPointer(v_vec);
  if (check_flag(v, "N_VGetArrayPointer", 0)) return 1;
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) return 1;
  s1 = N_VGetArrayPointer(ProbData->s1);
  if (check_flag(s1, "N_VGetArrayPointer", 0)) return 1;
  s2 = N_VGetArrayPointer(ProbData->s2);
  if (check_flag(s2, "N_VGetArrayPointer", 0)) return 1;
  N = ProbData->N;

  /* perform product at the left domain boundary (note: v is zero at the boundary)*/
  z[0] = (FIVE*v[0]*s2[0] - v[1]*s2[1])/s1[0];
    
  /* iterate through interior of local domain, performing product */
  for (i=1; i<N-1; i++) 
    z[i] = (-v[i-1]*s2[i-1] + FIVE*v[i]*s2[i] - v[i+1]*s2[i+1])/s1[i];

  /* perform product at the right domain boundary (note: v is zero at the boundary)*/ 
  z[N-1] = (-v[N-2]*s2[N-2] + FIVE*v[N-1]*s2[N-1])/s1[N-1];
  
  /* return with success */
  return 0;
}